

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compiler.cpp
# Opt level: O0

void __thiscall Arithemtic_LocalReuse_Test::TestBody(Arithemtic_LocalReuse_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_560;
  Message local_558;
  int local_550;
  IrRef local_54a;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_14;
  Message local_530;
  int local_528;
  IrRef local_522;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_13;
  Message local_508;
  IrOp local_4fc;
  IrIns local_4f8;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_12;
  IrIns ins_4;
  AssertHelper local_4b8;
  Message local_4b0;
  bool local_4a1;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar__4;
  Message local_488;
  int local_480;
  IrRef local_47a;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_11;
  Message local_460;
  int local_458;
  IrRef local_452;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_10;
  Message local_438;
  IrOp local_42c;
  IrIns local_428;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_9;
  IrIns ins_3;
  AssertHelper local_3e8;
  Message local_3e0;
  bool local_3d1;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar__3;
  Message local_3b8;
  int local_3b0;
  IrRef local_3aa;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_8;
  Message local_390;
  int local_388;
  IrRef local_382;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_7;
  Message local_368;
  IrOp local_35c;
  IrIns local_358;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_6;
  IrIns ins_2;
  AssertHelper local_318;
  Message local_310;
  bool local_301;
  undefined1 local_300 [8];
  AssertionResult gtest_ar__2;
  Message local_2e8;
  int local_2e0;
  IrRef local_2da;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_5;
  Message local_2c0;
  int local_2b8;
  IrRef local_2b2;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_4;
  Message local_298;
  IrOp local_28c;
  IrIns local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_3;
  IrIns ins_1;
  AssertHelper local_248;
  Message local_240;
  bool local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__1;
  Message local_218;
  int local_210;
  IrRef local_20a;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_2;
  Message local_1f0;
  int local_1e8;
  IrRef local_1e2;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_1;
  Message local_1c8;
  IrOp local_1bc;
  IrIns local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  IrIns ins;
  string local_190;
  AssertHelper local_170;
  Message local_168 [3];
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_;
  MockCompiler mock;
  BcIns arr [2];
  Arithemtic_LocalReuse_Test *this_local;
  
  mock.cur_ins._0_4_ = bc_new3(BC_ADD_LN,'\0','\0','\0');
  mock.cur_ins._4_4_ = bc_new3(BC_ADD_LN,'\0','\0','\x01');
  MockCompiler::MockCompiler((MockCompiler *)&gtest_ar_.message_,(BcIns *)&mock.cur_ins,2);
  local_149 = mock.trace < (Trace *)(long)*(int *)(mock.vm._264_8_ + 0x10);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_148,&local_149,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_190,(internal *)local_148,
               (AssertionResult *)"mock.cur_ins < mock.trace->ir_count","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
               ,0xa4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_170,local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    testing::Message::~Message(local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  if (bVar1) {
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         MockCompiler::next((MockCompiler *)&gtest_ar_.message_);
    local_1b8 = ir_op((IrIns)gtest_ar.message_.ptr_);
    local_1bc = IR_LOAD_STACK;
    testing::internal::EqHelper<false>::Compare<unsigned_long,IrOp>
              ((EqHelper<false> *)local_1b0,"ir_op(ins)","IR_LOAD_STACK",&local_1b8,&local_1bc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
    if (!bVar1) {
      testing::Message::Message(&local_1c8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                 ,0xa4,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_1c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
    if (bVar1) {
      local_1e2 = ir_arg1((IrIns)gtest_ar.message_.ptr_);
      local_1e8 = 0;
      testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                ((EqHelper<false> *)local_1e0,"ir_arg1(ins)","0",&local_1e2,&local_1e8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
      if (!bVar1) {
        testing::Message::Message(&local_1f0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                   ,0xa4,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1f0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_1f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
      if (bVar1) {
        local_20a = ir_arg2((IrIns)gtest_ar.message_.ptr_);
        local_210 = 0;
        testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                  ((EqHelper<false> *)local_208,"ir_arg2(ins)","0",&local_20a,&local_210);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
        if (!bVar1) {
          testing::Message::Message(&local_218);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                     ,0xa4,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__1.message_,&local_218);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
          testing::Message::~Message(&local_218);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
        if (bVar1) {
          local_231 = mock.trace < (Trace *)(long)*(int *)(mock.vm._264_8_ + 0x10);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_230,&local_231,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
          if (!bVar1) {
            testing::Message::Message(&local_240);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&ins_1,(internal *)local_230,
                       (AssertionResult *)"mock.cur_ins < mock.trace->ir_count","false","true",in_R9
                      );
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_248,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                       ,0xa5,pcVar2);
            testing::internal::AssertHelper::operator=(&local_248,&local_240);
            testing::internal::AssertHelper::~AssertHelper(&local_248);
            std::__cxx11::string::~string((string *)&ins_1);
            testing::Message::~Message(&local_240);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
          if (bVar1) {
            gtest_ar_3.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 MockCompiler::next((MockCompiler *)&gtest_ar_.message_);
            local_288 = ir_op((IrIns)gtest_ar_3.message_.ptr_);
            local_28c = IR_LOAD_CONST;
            testing::internal::EqHelper<false>::Compare<unsigned_long,IrOp>
                      ((EqHelper<false> *)local_280,"ir_op(ins)","IR_LOAD_CONST",&local_288,
                       &local_28c);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
            if (!bVar1) {
              testing::Message::Message(&local_298);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                         ,0xa5,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_4.message_,&local_298);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
              testing::Message::~Message(&local_298);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
            if (bVar1) {
              local_2b2 = ir_arg1((IrIns)gtest_ar_3.message_.ptr_);
              local_2b8 = 0;
              testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                        ((EqHelper<false> *)local_2b0,"ir_arg1(ins)","0",&local_2b2,&local_2b8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
              if (!bVar1) {
                testing::Message::Message(&local_2c0);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                           ,0xa5,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_5.message_,&local_2c0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_)
                ;
                testing::Message::~Message(&local_2c0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
              if (bVar1) {
                local_2da = ir_arg2((IrIns)gtest_ar_3.message_.ptr_);
                local_2e0 = 0;
                testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                          ((EqHelper<false> *)local_2d8,"ir_arg2(ins)","0",&local_2da,&local_2e0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2d8);
                if (!bVar1) {
                  testing::Message::Message(&local_2e8);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                             ,0xa5,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__2.message_,&local_2e8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__2.message_);
                  testing::Message::~Message(&local_2e8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
                if (bVar1) {
                  local_301 = mock.trace < (Trace *)(long)*(int *)(mock.vm._264_8_ + 0x10);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_300,&local_301,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_300);
                  if (!bVar1) {
                    testing::Message::Message(&local_310);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&ins_2,(internal *)local_300,
                               (AssertionResult *)"mock.cur_ins < mock.trace->ir_count","false",
                               "true",in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_318,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                               ,0xa6,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_318,&local_310);
                    testing::internal::AssertHelper::~AssertHelper(&local_318);
                    std::__cxx11::string::~string((string *)&ins_2);
                    testing::Message::~Message(&local_310);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
                  if (bVar1) {
                    gtest_ar_6.message_.ptr_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         MockCompiler::next((MockCompiler *)&gtest_ar_.message_);
                    local_358 = ir_op((IrIns)gtest_ar_6.message_.ptr_);
                    local_35c = IR_ADD;
                    testing::internal::EqHelper<false>::Compare<unsigned_long,IrOp>
                              ((EqHelper<false> *)local_350,"ir_op(ins)","IR_ADD",&local_358,
                               &local_35c);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_350);
                    if (!bVar1) {
                      testing::Message::Message(&local_368);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_350);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                 ,0xa6,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_7.message_,&local_368);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_7.message_);
                      testing::Message::~Message(&local_368);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
                    if (bVar1) {
                      local_382 = ir_arg1((IrIns)gtest_ar_6.message_.ptr_);
                      local_388 = 1;
                      testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                                ((EqHelper<false> *)local_380,"ir_arg1(ins)","1",&local_382,
                                 &local_388);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_380);
                      if (!bVar1) {
                        testing::Message::Message(&local_390);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_380);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                   ,0xa6,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_8.message_,&local_390);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_8.message_);
                        testing::Message::~Message(&local_390);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
                      if (bVar1) {
                        local_3aa = ir_arg2((IrIns)gtest_ar_6.message_.ptr_);
                        local_3b0 = 2;
                        testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                                  ((EqHelper<false> *)local_3a8,"ir_arg2(ins)","2",&local_3aa,
                                   &local_3b0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_3a8);
                        if (!bVar1) {
                          testing::Message::Message(&local_3b8);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_3a8);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar__3.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                     ,0xa6,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar__3.message_,&local_3b8);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar__3.message_);
                          testing::Message::~Message(&local_3b8);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
                        if (bVar1) {
                          local_3d1 = mock.trace < (Trace *)(long)*(int *)(mock.vm._264_8_ + 0x10);
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_3d0,&local_3d1,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_3d0);
                          if (!bVar1) {
                            testing::Message::Message(&local_3e0);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&ins_3,(internal *)local_3d0,
                                       (AssertionResult *)"mock.cur_ins < mock.trace->ir_count",
                                       "false","true",in_R9);
                            pcVar2 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_3e8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                       ,0xa7,pcVar2);
                            testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
                            testing::internal::AssertHelper::~AssertHelper(&local_3e8);
                            std::__cxx11::string::~string((string *)&ins_3);
                            testing::Message::~Message(&local_3e0);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
                          if (bVar1) {
                            gtest_ar_9.message_.ptr_ =
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)MockCompiler::next((MockCompiler *)&gtest_ar_.message_);
                            local_428 = ir_op((IrIns)gtest_ar_9.message_.ptr_);
                            local_42c = IR_LOAD_CONST;
                            testing::internal::EqHelper<false>::Compare<unsigned_long,IrOp>
                                      ((EqHelper<false> *)local_420,"ir_op(ins)","IR_LOAD_CONST",
                                       &local_428,&local_42c);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_420);
                            if (!bVar1) {
                              testing::Message::Message(&local_438);
                              pcVar2 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_420);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                         ,0xa7,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_10.message_,&local_438);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_10.message_);
                              testing::Message::~Message(&local_438);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_420)
                            ;
                            if (bVar1) {
                              local_452 = ir_arg1((IrIns)gtest_ar_9.message_.ptr_);
                              local_458 = 1;
                              testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                                        ((EqHelper<false> *)local_450,"ir_arg1(ins)","1",&local_452,
                                         &local_458);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_450);
                              if (!bVar1) {
                                testing::Message::Message(&local_460);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_450);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                           ,0xa7,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_11.message_,&local_460);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_11.message_);
                                testing::Message::~Message(&local_460);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_450);
                              if (bVar1) {
                                local_47a = ir_arg2((IrIns)gtest_ar_9.message_.ptr_);
                                local_480 = 0;
                                testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                                          ((EqHelper<false> *)local_478,"ir_arg2(ins)","0",
                                           &local_47a,&local_480);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_478);
                                if (!bVar1) {
                                  testing::Message::Message(&local_488);
                                  pcVar2 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_478);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar__4.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                             ,0xa7,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar__4.message_,&local_488);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar__4.message_);
                                  testing::Message::~Message(&local_488);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_478);
                                if (bVar1) {
                                  local_4a1 = mock.trace <
                                              (Trace *)(long)*(int *)(mock.vm._264_8_ + 0x10);
                                  testing::AssertionResult::AssertionResult<bool>
                                            ((AssertionResult *)local_4a0,&local_4a1,(type *)0x0);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_4a0);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_4b0);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              ((string *)&ins_4,(internal *)local_4a0,
                                               (AssertionResult *)
                                               "mock.cur_ins < mock.trace->ir_count","false","true",
                                               in_R9);
                                    pcVar2 = (char *)std::__cxx11::string::c_str();
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_4b8,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                               ,0xa8,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              (&local_4b8,&local_4b0);
                                    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
                                    std::__cxx11::string::~string((string *)&ins_4);
                                    testing::Message::~Message(&local_4b0);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_4a0);
                                  if (bVar1) {
                                    gtest_ar_12.message_.ptr_ =
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)MockCompiler::next((MockCompiler *)&gtest_ar_.message_);
                                    local_4f8 = ir_op((IrIns)gtest_ar_12.message_.ptr_);
                                    local_4fc = IR_ADD;
                                    testing::internal::EqHelper<false>::Compare<unsigned_long,IrOp>
                                              ((EqHelper<false> *)local_4f0,"ir_op(ins)","IR_ADD",
                                               &local_4f8,&local_4fc);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_4f0);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_508);
                                      pcVar2 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_4f0);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_13.message_,kFatalFailure
                                                 ,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                                 ,0xa8,pcVar2);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_13.message_,&local_508);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_13.message_);
                                      testing::Message::~Message(&local_508);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_4f0);
                                    if (bVar1) {
                                      local_522 = ir_arg1((IrIns)gtest_ar_12.message_.ptr_);
                                      local_528 = 3;
                                      testing::internal::EqHelper<false>::
                                      Compare<unsigned_short,int>
                                                ((EqHelper<false> *)local_520,"ir_arg1(ins)","3",
                                                 &local_522,&local_528);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_520);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_530);
                                        pcVar2 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_520);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_14.message_,
                                                   kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                                  ,0xa8,pcVar2);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_14.message_,&local_530)
                                        ;
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_14.message_);
                                        testing::Message::~Message(&local_530);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_520);
                                      if (bVar1) {
                                        local_54a = ir_arg2((IrIns)gtest_ar_12.message_.ptr_);
                                        local_550 = 4;
                                        testing::internal::EqHelper<false>::
                                        Compare<unsigned_short,int>
                                                  ((EqHelper<false> *)local_548,"ir_arg2(ins)","4",
                                                   &local_54a,&local_550);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_548);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_558);
                                          pcVar2 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_548);
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_560,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                                                  ,0xa8,pcVar2);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_560,&local_558);
                                          testing::internal::AssertHelper::~AssertHelper(&local_560)
                                          ;
                                          testing::Message::~Message(&local_558);
                                        }
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_548);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  MockCompiler::~MockCompiler((MockCompiler *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(Arithemtic, LocalReuse) {
	// let a = 0 while true { a = a + 1 a = a + 2}
	MOCK(
		BC3(BC_ADD_LN, 0, 0, 0),
		BC3(BC_ADD_LN, 0, 0, 1),
	);

	INS(IR_LOAD_STACK, 0, 0);
	INS(IR_LOAD_CONST, 0, 0);
	INS(IR_ADD, 1, 2);
	INS(IR_LOAD_CONST, 1, 0);
	INS(IR_ADD, 3, 4);
}